

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::ReadListFile(cmMakefile *this,string *filename)

{
  bool bVar1;
  bool bVar2;
  string *in_base;
  ListFileScope scope;
  cmListFile listFile;
  string filenametoread;
  ListFileScope LStack_68;
  cmListFile local_58;
  string local_40;
  
  in_base = GetCurrentSourceDirectory_abi_cxx11_(this);
  cmsys::SystemTools::CollapseFullPath(&local_40,filename,in_base);
  ListFileScope::ListFileScope(&LStack_68,this,&local_40);
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = cmListFile::ParseFile
                    (&local_58,local_40._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,&this->Backtrace);
  if (bVar1) {
    RunListFile(this,&local_58,&local_40,(DeferCommands *)0x0);
    bVar2 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar2) {
      LStack_68.ReportError = false;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_58.Functions)
  ;
  ListFileScope::~ListFileScope(&LStack_68);
  std::__cxx11::string::~string((string *)&local_40);
  return bVar1;
}

Assistant:

bool cmMakefile::ReadListFile(const std::string& filename)
{
  std::string filenametoread = cmSystemTools::CollapseFullPath(
    filename, this->GetCurrentSourceDirectory());

  ListFileScope scope(this, filenametoread);

  cmListFile listFile;
  if (!listFile.ParseFile(filenametoread.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return false;
  }

  this->RunListFile(listFile, filenametoread);
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }
  return true;
}